

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActivationFactory.cpp
# Opt level: O0

string * __thiscall
PyreNet::ActivationFactory::toString_abi_cxx11_
          (string *__return_storage_ptr__,ActivationFactory *this,activationType activation)

{
  exception *this_00;
  undefined4 in_register_00000014;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  undefined4 local_14;
  string *psStack_10;
  activationType activation_local;
  
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xffffffff) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"step",&local_15);
    std::allocator<char>::~allocator(&local_15);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"linear",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"sigmoid",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"tanh",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"relu",&local_28);
    std::allocator<char>::~allocator(&local_28);
    break;
  default:
    this_00 = (exception *)
              __cxa_allocate_exception(8,this,CONCAT44(in_register_00000014,activation));
    std::exception::exception(this_00);
    __cxa_throw(this_00,&std::exception::typeinfo,std::exception::~exception);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ActivationFactory::toString(LayerDefinition::activationType activation) {
        switch (activation) {
            case LayerDefinition::step: {
                return "step";
            }
            case LayerDefinition::linear: {
                return "linear";
            }
            case LayerDefinition::tanh: {
                return "tanh";
            }
            case LayerDefinition::sigmoid: {
                return "sigmoid";
            }
            case LayerDefinition::relu: {
                return "relu";
            }
            default: {
                throw std::exception();
            }
        }
    }